

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::notify_delete(CVmObjGramProd *this,int param_2)

{
  vmgram_alt_info **__ptr;
  CVmGramProdMem *pCVar1;
  vm_gram_ext *pvVar2;
  CVmVarHeap *pCVar3;
  undefined4 in_ESI;
  CVmGramProdMem *in_RDI;
  vmgram_alt_info **alts;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI->block_cur_ != (CVmGramProdMemBlock *)0x0) {
    pvVar2 = get_ext((CVmObjGramProd *)in_RDI);
    __ptr = pvVar2->alts_;
    if (__ptr != (vmgram_alt_info **)0x0) {
      clear_alts((CVmObjGramProd *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
      free(__ptr);
    }
    pvVar2 = get_ext((CVmObjGramProd *)in_RDI);
    pCVar1 = pvVar2->mem_;
    if (pCVar1 != (CVmGramProdMem *)0x0) {
      CVmGramProdMem::~CVmGramProdMem(in_RDI);
      operator_delete(pCVar1,0x20);
    }
    pvVar2 = get_ext((CVmObjGramProd *)in_RDI);
    free(pvVar2->prop_enum_arr_);
    pCVar3 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar3->_vptr_CVmVarHeap[6])(pCVar3,in_RDI->block_cur_);
  }
  return;
}

Assistant:

void CVmObjGramProd::notify_delete(VMG_ int /*in_root_set*/)
{
    /* free our additional data */
    if (ext_ != 0)
    {
        /* if we've allocated alternatives, delete them */
        vmgram_alt_info **alts = get_ext()->alts_;
        if (alts != 0)
        {
            /* delete the alternative objects */
            clear_alts();

            /* free the alternative array itself */
            t3free(alts);
        }

        /* delete our memory pool */
        delete get_ext()->mem_;

        /* delete our property enumeration space */
        t3free(get_ext()->prop_enum_arr_);
        
        /* free the extension */
        G_mem->get_var_heap()->free_mem(ext_);
    }
}